

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined1 uVar5;
  long in_FS_OFFSET;
  QPointF args_local_1;
  QPointF args_local;
  WheelEvent event;
  
  args_local.yp = args_2.yp;
  args_local.xp = args_2.xp;
  args_local_1.yp = args_3.yp;
  args_local_1.xp = args_3.xp;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QThread::isMainThread();
  if (cVar2 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,
               args_12);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bVar3 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar3;
    }
  }
  else {
    memcpy(&event,&DAT_005de080,0x88);
    QWindowSystemInterfacePrivate::WheelEvent::WheelEvent
              (&event,args,args_1,&args_local,&args_local_1,args_4,args_5,args_6,args_7,
               (KeyboardModifiers)
               args_8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i,args_9,args_10,args_11,args_12);
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)&event);
      uVar5 = event.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
    }
    else {
      iVar4 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&event);
      uVar5 = event.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
      if ((char)iVar4 == '\0') {
        uVar5 = 0;
      }
    }
    QWindowSystemInterfacePrivate::UserEvent::~UserEvent((UserEvent *)&event);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (bool)uVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}